

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::PrintGencodeVersionValidator
          (java *this,Printer *printer,bool oss_runtime,string_view java_class_name)

{
  char *pcVar1;
  Version *pVVar2;
  Nonnull<char_*> pcVar3;
  undefined8 *puVar4;
  AlphaNum *pAVar5;
  undefined7 in_register_00000011;
  AlphaNum *c;
  string_view text;
  AlphaNum *local_2e8;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  undefined8 local_240;
  char *local_238;
  undefined8 local_210;
  char *local_208;
  AlphaNum local_1e0;
  AlphaNum local_1b0;
  AlphaNum local_180;
  AlphaNum local_150;
  undefined8 local_120;
  size_t local_118;
  AlphaNum local_f0;
  AlphaNum local_c0;
  undefined8 local_90;
  char *local_88;
  undefined8 local_60;
  char *local_58;
  
  c = (AlphaNum *)java_class_name._M_str;
  pVVar2 = GetProtobufJavaVersion(SUB81(printer,0));
  pcVar1 = "_runtime_version.Domain.GOOGLE_INTERNAL";
  if ((int)printer != 0) {
    pcVar1 = "_runtime_version.Domain.PUBLIC";
  }
  pAVar5 = (AlphaNum *)(pcVar1 + 0x18);
  local_60 = 0xd;
  local_58 = "/* major= */ ";
  pcVar1 = local_180.digits_;
  local_2e8 = pAVar5;
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((pVVar2->field_0)._impl_.major_,pcVar1);
  local_180.piece_._M_len = (long)pcVar3 - (long)pcVar1;
  local_180.piece_._M_str = pcVar1;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_2e0,(lts_20250127 *)&local_60,&local_180,pAVar5);
  local_210 = 0xd;
  local_208 = "/* minor= */ ";
  pcVar1 = local_1b0.digits_;
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((pVVar2->field_0)._impl_.minor_,pcVar1);
  local_1b0.piece_._M_len = (long)pcVar3 - (long)pcVar1;
  local_1b0.piece_._M_str = pcVar1;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_260,(lts_20250127 *)&local_210,&local_1b0,pAVar5);
  local_240 = 0xd;
  local_238 = "/* patch= */ ";
  pcVar1 = local_1e0.digits_;
  pcVar3 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((pVVar2->field_0)._impl_.patch_,pcVar1);
  local_1e0.piece_._M_len = (long)pcVar3 - (long)pcVar1;
  local_1e0.piece_._M_str = pcVar1;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_280,(lts_20250127 *)&local_240,&local_1e0,pAVar5);
  local_90 = 0xf;
  local_88 = "/* suffix= */ \"";
  puVar4 = (undefined8 *)
           ((ulong)(pVVar2->field_0)._impl_.suffix_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  local_c0.piece_._M_str = (char *)*puVar4;
  local_c0.piece_._M_len = puVar4[1];
  pAVar5 = &local_f0;
  local_f0.piece_._M_len = 1;
  local_f0.piece_._M_str = "\"";
  absl::lts_20250127::StrCat_abi_cxx11_(&local_2a0,(lts_20250127 *)&local_90,&local_c0,pAVar5,c);
  local_150.piece_._M_len = 0x10;
  local_150.piece_._M_str = ".class.getName()";
  local_120 = CONCAT71(in_register_00000011,oss_runtime);
  local_118 = java_class_name._M_len;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_2c0,(lts_20250127 *)&local_120,&local_150,pAVar5);
  text._M_str = 
  "com.google.protobuf.RuntimeVersion.validateProtobufGencodeVersion(\n  com.google.protobuf.RuntimeVersion.RuntimeDomain.$domain$,\n  $major$,\n  $minor$,\n  $patch$,\n  $suffix$,\n  $location$);\n"
  ;
  text._M_len = 0xbc;
  io::Printer::
  Print<char[7],char_const*,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            ((Printer *)this,text,(char (*) [7])"domain",(char **)&local_2e8,(char (*) [6])"major",
             &local_2e0,(char (*) [6])"minor",&local_260,(char (*) [6])"patch",&local_280,
             (char (*) [7])0x1301bb5,&local_2a0,(char (*) [9])0x106f4b7,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrintGencodeVersionValidator(io::Printer* printer, bool oss_runtime,
                                  absl::string_view java_class_name) {
  const auto& version = GetProtobufJavaVersion(oss_runtime);
  printer->Print(
      "com.google.protobuf.RuntimeVersion.validateProtobufGencodeVersion(\n"
      "  com.google.protobuf.RuntimeVersion.RuntimeDomain.$domain$,\n"
      "  $major$,\n"
      "  $minor$,\n"
      "  $patch$,\n"
      "  $suffix$,\n"
      "  $location$);\n",
      "domain", oss_runtime ? "PUBLIC" : "GOOGLE_INTERNAL", "major",
      absl::StrCat("/* major= */ ", version.major()), "minor",
      absl::StrCat("/* minor= */ ", version.minor()), "patch",
      absl::StrCat("/* patch= */ ", version.patch()), "suffix",
      absl::StrCat("/* suffix= */ \"", version.suffix(), "\""), "location",
      absl::StrCat(java_class_name, ".class.getName()"));
}